

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dots_reporter.h
# Opt level: O0

void __thiscall
bandit::detail::dots_reporter::test_run_error(dots_reporter *this,char *desc,test_run_error *err)

{
  ostream *poVar1;
  char *pcVar2;
  value_type local_1f8 [32];
  undefined1 local_1d8 [56];
  stringstream ss;
  ostream local_198 [376];
  test_run_error *local_20;
  test_run_error *err_local;
  char *desc_local;
  dots_reporter *this_local;
  
  local_20 = err;
  err_local = (test_run_error *)desc;
  desc_local = (char *)this;
  progress_reporter::test_run_error(&this->super_progress_reporter,desc,err);
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1d8 + 0x30));
  std::ostream::operator<<(local_198,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_198,"Failed to run \"");
  progress_reporter::current_context_name_abi_cxx11_((progress_reporter *)local_1d8);
  poVar1 = std::operator<<(poVar1,(string *)local_1d8);
  poVar1 = std::operator<<(poVar1,"\": error \"");
  pcVar2 = (char *)(**(code **)(*(long *)local_20 + 0x10))();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::str();
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_progress_reporter).test_run_errors_,local_1f8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1d8 + 0x30));
  return;
}

Assistant:

void test_run_error(const char* desc, const struct test_run_error& err)
    {
      progress_reporter::test_run_error(desc, err);

      std::stringstream ss;
      ss << std::endl;
      ss << "Failed to run \"" << current_context_name() << "\": error \"" << err.what() << "\"" << std::endl;

      test_run_errors_.push_back(ss.str());
    }